

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlp_overlay.cpp
# Opt level: O1

bool __thiscall r_exec::HLPOverlay::check_fwd_timings(HLPOverlay *this)

{
  ushort uVar1;
  ushort uVar2;
  _Object *p_Var3;
  short sVar4;
  byte bVar5;
  char cVar6;
  byte bVar7;
  bool bVar8;
  bool bVar9;
  uint uVar10;
  uint64_t uVar11;
  int iVar12;
  ulong uVar13;
  short sVar14;
  uint16_t result_index;
  Atom a;
  int local_64;
  uint16_t local_5a;
  ulong local_58;
  HLPContext local_50;
  int iVar15;
  
  p_Var3 = (this->bindings).object;
  uVar1 = *(ushort *)((long)&p_Var3[3]._vptr__Object + 2);
  uVar2 = *(ushort *)((long)&p_Var3[3]._vptr__Object + 4);
  uVar10 = r_code::Atom::asIndex();
  bVar5 = r_code::Atom::getAtomCount();
  local_58 = (ulong)uVar10;
  if (bVar5 == 0) {
    sVar14 = -1;
    local_64._0_2_ = -1;
  }
  else {
    local_64 = 0xffff;
    uVar13 = 0;
    iVar15 = 0xffff;
    do {
      local_50.super__Context._vptr__Context._0_4_ =
           *(undefined4 *)
            ((this->super_Overlay).code + (ulong)((int)uVar13 + (uVar10 + 1 & 0xffff) & 0xffff) * 4)
      ;
      cVar6 = r_code::Atom::getDescriptor();
      if (cVar6 == -0x73) {
        bVar7 = r_code::Atom::asAssignmentIndex();
        iVar12 = (int)uVar13 + 1;
        if (uVar1 == bVar7) {
          local_64 = iVar12;
        }
        if (uVar2 == bVar7) {
          iVar15 = iVar12;
        }
      }
      sVar14 = (short)iVar15;
      r_code::Atom::~Atom((Atom *)&local_50);
      uVar13 = uVar13 + 1;
    } while (bVar5 != uVar13);
  }
  sVar4 = (short)local_58;
  bVar9 = false;
  HLPContext::HLPContext(&local_50,(this->super_Overlay).code,sVar14 + sVar4,this,STEM);
  bVar8 = HLPContext::evaluate(&local_50,&local_5a);
  if (bVar8) {
    uVar11 = BindingMap::get_fwd_before((BindingMap *)(this->bindings).object);
    uVar13 = (*Now)();
    if (uVar13 < uVar11) {
      HLPContext::HLPContext(&local_50,(this->super_Overlay).code,(short)local_64 + sVar4,this,STEM)
      ;
      bVar9 = HLPContext::evaluate(&local_50,&local_5a);
    }
    else {
      bVar9 = false;
    }
  }
  return bVar9;
}

Assistant:

bool HLPOverlay::check_fwd_timings()
{
    int16_t fwd_after_guard_index = -1;
    int16_t fwd_before_guard_index = -1;
    uint16_t bm_fwd_after_index = bindings->get_fwd_after_index();
    uint16_t bm_fwd_before_index = bindings->get_fwd_before_index();
    uint16_t guard_set_index = code[HLP_BWD_GUARDS].asIndex();
    uint16_t guard_count = code[guard_set_index].getAtomCount();

    for (uint16_t i = 1; i <= guard_count; ++i) { // find the relevant guards.
        uint16_t index = guard_set_index + i;
        Atom a = code[index];

        if (a.getDescriptor() == Atom::ASSIGN_PTR) {
            uint16_t _i = a.asAssignmentIndex();

            if (_i == bm_fwd_after_index) {
                fwd_after_guard_index = i;
            }

            if (_i == bm_fwd_before_index) {
                fwd_before_guard_index = i;
            }
        }
    }

    if (!evaluate(guard_set_index + fwd_before_guard_index)) {
        return false;
    }

    if (bindings->get_fwd_before() <= Now()) {
        return false;
    }

    if (!evaluate(guard_set_index + fwd_after_guard_index)) {
        return false;
    }

    return true;
}